

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O3

string * __thiscall
flatbuffers::java::JavaGenerator::ConvertPrimitiveTypeToObjectWrapper_ObjectAPI
          (string *__return_storage_ptr__,JavaGenerator *this,string *type_name)

{
  pointer pcVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  iVar2 = std::__cxx11::string::compare((char *)type_name);
  if (iVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "Boolean";
    pcVar3 = "";
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)type_name);
    if (iVar2 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = "Byte";
      pcVar3 = "";
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)type_name);
      if (iVar2 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar4 = "Character";
        pcVar3 = "";
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)type_name);
        if (iVar2 == 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar4 = "Short";
          pcVar3 = "";
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)type_name);
          if (iVar2 == 0) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar4 = "Integer";
            pcVar3 = "";
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)type_name);
            if (iVar2 == 0) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              pcVar4 = "Long";
              pcVar3 = "";
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)type_name);
              if (iVar2 == 0) {
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                pcVar4 = "Float";
                pcVar3 = "";
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)type_name);
                (__return_storage_ptr__->_M_dataplus)._M_p =
                     (pointer)&__return_storage_ptr__->field_2;
                if (iVar2 != 0) {
                  pcVar1 = (type_name->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)__return_storage_ptr__,pcVar1,
                             pcVar1 + type_name->_M_string_length);
                  return __return_storage_ptr__;
                }
                pcVar4 = "Double";
                pcVar3 = "";
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string ConvertPrimitiveTypeToObjectWrapper_ObjectAPI(
      const std::string &type_name) const {
    if (type_name == "boolean")
      return "Boolean";
    else if (type_name == "byte")
      return "Byte";
    else if (type_name == "char")
      return "Character";
    else if (type_name == "short")
      return "Short";
    else if (type_name == "int")
      return "Integer";
    else if (type_name == "long")
      return "Long";
    else if (type_name == "float")
      return "Float";
    else if (type_name == "double")
      return "Double";
    return type_name;
  }